

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

AString * AString_constructWithCapacityAndAllocator
                    (size_t capacity,ACUtilsReallocator reallocator,ACUtilsDeallocator deallocator)

{
  undefined8 uVar1;
  ACUtilsReallocator local_58;
  AString tmpString;
  AString *string;
  ACUtilsDeallocator deallocator_local;
  ACUtilsReallocator reallocator_local;
  size_t capacity_local;
  
  if ((reallocator == (ACUtilsReallocator)0x0) || (deallocator == (ACUtilsDeallocator)0x0)) {
    capacity_local = 0;
  }
  else {
    reallocator_local = (ACUtilsReallocator)capacity;
    if (capacity < 8) {
      reallocator_local = (ACUtilsReallocator)0x8;
    }
    tmpString.buffer = (char *)(*reallocator)((void *)0x0,0x28);
    if (tmpString.buffer != (char *)0x0) {
      tmpString.deallocator = (ACUtilsDeallocator)0x0;
      tmpString.size = 0;
      tmpString.capacity = 0;
      local_58 = reallocator;
      tmpString.reallocator = (ACUtilsReallocator)deallocator;
      memcpy(tmpString.buffer,&local_58,0x28);
      tmpString.buffer[0x10] = '\0';
      tmpString.buffer[0x11] = '\0';
      tmpString.buffer[0x12] = '\0';
      tmpString.buffer[0x13] = '\0';
      tmpString.buffer[0x14] = '\0';
      tmpString.buffer[0x15] = '\0';
      tmpString.buffer[0x16] = '\0';
      tmpString.buffer[0x17] = '\0';
      *(ACUtilsReallocator *)(tmpString.buffer + 0x18) = reallocator_local;
      uVar1 = (**(code **)tmpString.buffer)(0,*(long *)(tmpString.buffer + 0x18) + 1);
      *(undefined8 *)(tmpString.buffer + 0x20) = uVar1;
      if (*(long *)(tmpString.buffer + 0x20) == 0) {
        AString_destruct((AString *)tmpString.buffer);
        return (AString *)0x0;
      }
      **(undefined1 **)(tmpString.buffer + 0x20) = 0;
    }
    capacity_local = (size_t)tmpString.buffer;
  }
  return (AString *)capacity_local;
}

Assistant:

AString* AString_constructWithCapacityAndAllocator(size_t capacity, ACUtilsReallocator reallocator, ACUtilsDeallocator deallocator)
{
    struct AString *string;
    if(reallocator == nullptr || deallocator == nullptr)
        return nullptr;
    if(capacity < private_ACUtils_AString_capacityMin)
        capacity = private_ACUtils_AString_capacityMin;
    string = (struct AString*) reallocator(nullptr, sizeof(struct AString));
    if(string != nullptr) {
        struct AString tmpString = { reallocator, deallocator};
        memcpy(string, &tmpString, sizeof(struct AString));
        string->size = 0;
        string->capacity = capacity;
        string->buffer = (char*) string->reallocator(nullptr, (string->capacity + 1) * sizeof(char));
        if(string->buffer == nullptr) {
            AString_destruct(string);
            return nullptr;
        }
        string->buffer[0] = '\0';
    }
    return string;
}